

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileStoreTestCase.cpp
# Opt level: O1

void __thiscall
SuiteFileStoreTests::
TestresetBeforeAndAfterWithTestFileManagerFileStoreFactory_FileStoreFromDictionary::RunImpl
          (TestresetBeforeAndAfterWithTestFileManagerFileStoreFactory_FileStoreFromDictionary *this)

{
  TestDetails *details;
  resetBeforeAndAfterWithTestFileManagerFileStoreFactory_FileStoreFromDictionaryHelper fixtureHelper
  ;
  resetBeforeAndAfterWithTestFileManagerFileStoreFactory_FileStoreFromDictionaryHelper rStack_1c8;
  
  details = &(this->super_Test).m_details;
  resetBeforeAndAfterWithTestFileManager::resetBeforeAndAfterWithTestFileManager
            (&rStack_1c8.super_resetBeforeAndAfterWithTestFileManager);
  rStack_1c8.m_details = details;
  UnitTest::
  ExecuteTest<SuiteFileStoreTests::resetBeforeAndAfterWithTestFileManagerFileStoreFactory_FileStoreFromDictionaryHelper>
            (&rStack_1c8,details);
  fileStoreFixture::~fileStoreFixture((fileStoreFixture *)&rStack_1c8);
  return;
}

Assistant:

TEST_FIXTURE(resetBeforeAndAfterWithTestFileManager, FileStoreFactory_FileStoreFromDictionary) {
  SessionID sessionID( BeginString( "FIX.4.2" ),
      SenderCompID( "SETGET" ), TargetCompID( "TEST" ));
  Dictionary dictionary;
  dictionary.setString("ConnectionType", "acceptor");
  dictionary.setString("FileStorePath", "store");

  SessionSettings settings;
  settings.set(sessionID, dictionary);
  FileStoreFactory fileStoreFactory(settings);

  MessageStore* fileStore = fileStoreFactory.create(sessionID);
  CHECK(fileStore != nullptr);
}